

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int check_plan(void)

{
  int iVar1;
  int local_c;
  int res;
  int r;
  
  local_c = 0;
  if (tests_done[level] != plan_test[level]) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"# Looks like you planned %d tests but ran %d.\n",(ulong)(uint)plan_test[level],
            (ulong)(uint)tests_done[level]);
    local_c = -1;
  }
  if (tests_failed[level] != 0) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"# Looks like you failed %d test of %d run.\n",(ulong)(uint)tests_failed[level],
            (ulong)(uint)tests_done[level]);
    local_c = tests_failed[level];
  }
  level = level + -1;
  if ((-1 < level) && (iVar1 = __ok((uint)(local_c == 0),"subtests"), iVar1 == 0)) {
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   Failed test \'");
    fprintf(_stderr,"subtests");
    fprintf(_stderr,"\'\n");
    __space((FILE *)_stderr);
    fprintf(_stderr,"#   in %s at line %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/common/test.c"
            ,0x35);
  }
  return local_c;
}

Assistant:

int
check_plan(void)
{
	int r = 0;
	if (tests_done[level] != plan_test[level]) {
		__space(stderr);
		fprintf(stderr,
			"# Looks like you planned %d tests but ran %d.\n",
			plan_test[level], tests_done[level]);
		r = -1;
	}

	if (tests_failed[level]) {
		__space(stderr);
		fprintf(stderr,
			"# Looks like you failed %d test of %d run.\n",
			tests_failed[level], tests_done[level]);
		r = tests_failed[level];
	}
	--level;
	if (level >= 0) {
		is(r, 0, "subtests");
	}
	return r;
}